

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty.c++
# Opt level: O2

Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_> __thiscall
capnp::TwoPartyVatNetwork::receiveIncomingMessage(TwoPartyVatNetwork *this)

{
  PromiseArena *pPVar1;
  SourceLocation location;
  VatNetworkBase VVar2;
  void *pvVar3;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_twoparty_c__:305:24)>
  *location_00;
  OwnPromiseNode intermediate;
  void *continuationTracePtr;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_68;
  anon_class_8_1_8991fb9c_for_func local_60;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_58;
  code *local_50;
  VatNetworkBase local_48;
  undefined *local_40;
  undefined *puStack_38;
  undefined8 local_30;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_28;
  
  kj::yield();
  local_50 = kj::_::
             SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty.c++:305:24)>
             ::anon_class_8_1_8991fb9c_for_func::operator();
  pPVar1 = ((local_68.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_68.ptr - (long)pPVar1) < 0x28) {
    pvVar3 = operator_new(0x400);
    location_00 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_twoparty_c__:305:24)>
                   *)((long)pvVar3 + 0x3d8);
    kj::
    ctor<kj::_::SimpleTransformPromiseNode<void,capnp::TwoPartyVatNetwork::receiveIncomingMessage()::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,capnp::TwoPartyVatNetwork::receiveIncomingMessage()::__0,void*&>
              (location_00,&local_68,&local_60,&local_50);
    *(void **)((long)pvVar3 + 0x3e0) = pvVar3;
  }
  else {
    ((local_68.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    location_00 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_twoparty_c__:305:24)>
                   *)&local_68.ptr[-3].super_PromiseArenaMember.arena;
    kj::
    ctor<kj::_::SimpleTransformPromiseNode<void,capnp::TwoPartyVatNetwork::receiveIncomingMessage()::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,capnp::TwoPartyVatNetwork::receiveIncomingMessage()::__0,void*&>
              (location_00,&local_68,&local_60,&local_50);
    local_68.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  local_40 = &DAT_0042a172;
  puStack_38 = &DAT_0042a1d1;
  local_30 = 0x4c0000058b;
  location.function = &DAT_0042a1d1;
  location.fileName = &DAT_0042a172;
  location.lineNumber = 0x58b;
  location.columnNumber = 0x4c;
  local_58.ptr = (PromiseNode *)location_00;
  kj::_::maybeChain<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,decltype(nullptr)>>>
            ((OwnPromiseNode *)&local_48,
             (Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_> *)&local_58,
             location);
  VVar2._vptr_VatNetworkBase = local_48._vptr_VatNetworkBase;
  local_48._vptr_VatNetworkBase = (_func_int **)0x0;
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_48);
  (this->super_TwoPartyVatNetworkBase).super_VatNetworkBase._vptr_VatNetworkBase =
       VVar2._vptr_VatNetworkBase;
  local_28.ptr = (PromiseNode *)0x0;
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_28);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_58);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_68);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<kj::Maybe<kj::Own<IncomingRpcMessage>>> TwoPartyVatNetwork::receiveIncomingMessage() {
  return kj::evalLater([this]() -> kj::Promise<kj::Maybe<kj::Own<IncomingRpcMessage>>> {
    KJ_IF_SOME(e, readCancelReason) {
      // A previous write failed; propagate the failure to reads, too.
      return kj::cp(e);
    }

    kj::Array<kj::OwnFd> fdSpace = nullptr;
    if(maxFdsPerMessage > 0) {
      fdSpace = kj::heapArray<kj::OwnFd>(maxFdsPerMessage);
    }
    auto promise = readCanceler.wrap(getStream().tryReadMessage(fdSpace, receiveOptions));
    return promise.then([fdSpace = kj::mv(fdSpace)]
                        (kj::Maybe<MessageReaderAndFds>&& messageAndFds) mutable
                      -> kj::Maybe<kj::Own<IncomingRpcMessage>> {
      KJ_IF_SOME(m, messageAndFds) {
        if (m.fds.size() > 0) {
          return kj::Own<IncomingRpcMessage>(
              kj::heap<IncomingMessageImpl>(kj::mv(m), kj::mv(fdSpace)));
        } else {
          return kj::Own<IncomingRpcMessage>(kj::heap<IncomingMessageImpl>(kj::mv(m.reader)));
        }
      } else {
        return kj::none;
      }
    });
  });
}